

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O2

Fad<float> * __thiscall Fad<float>::operator/=(Fad<float> *this,float *val)

{
  uint uVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->val_ = this->val_ / *val;
  uVar1 = (this->dx_).num_elts;
  if (uVar1 != 0) {
    pfVar2 = (this->dx_).ptr_to_data;
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      pfVar2[uVar4] = pfVar2[uVar4] / *val;
    }
  }
  return this;
}

Assistant:

inline  Fad<T> & Fad<T>::operator/= (const T& val)
{
  val_ /= val;

  int sz = dx_.size();
  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    for (int i=0; i<sz;++i)
      dxp[i] /= val;
  }

  return *this;
}